

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.hpp
# Opt level: O1

mat<4,_4,_float,_(glm::qualifier)0> *
glm::toMat4<float,(glm::qualifier)0>(qua<float,_(glm::qualifier)0> *x)

{
  float fVar1;
  float fVar2;
  mat<4,_4,_float,_(glm::qualifier)0> *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar5 = x->x;
  fVar1 = x->y;
  fVar4 = x->z;
  fVar2 = x->w;
  fVar9 = fVar1 * fVar1 + fVar4 * fVar4;
  fVar10 = fVar5 * fVar1 + fVar4 * fVar2;
  fVar11 = fVar5 * fVar4 - fVar1 * fVar2;
  fVar6 = fVar5 * fVar1 - fVar4 * fVar2;
  fVar7 = fVar4 * fVar4 + fVar5 * fVar5;
  fVar8 = fVar1 * fVar4 + fVar5 * fVar2;
  fVar3 = fVar1 * fVar2 + fVar5 * fVar4;
  fVar4 = fVar1 * fVar4 - fVar5 * fVar2;
  fVar5 = fVar1 * fVar1 + fVar5 * fVar5;
  in_RDI->value[0].field_0.x = 1.0 - (fVar9 + fVar9);
  in_RDI->value[0].field_1.y = fVar10 + fVar10;
  in_RDI->value[0].field_2.z = fVar11 + fVar11;
  in_RDI->value[0].field_3.w = 0.0;
  in_RDI->value[1].field_0.x = fVar6 + fVar6;
  in_RDI->value[1].field_1.y = 1.0 - (fVar7 + fVar7);
  in_RDI->value[1].field_2.z = fVar8 + fVar8;
  in_RDI->value[1].field_3.w = 0.0;
  in_RDI->value[2].field_0.x = fVar3 + fVar3;
  in_RDI->value[2].field_1.y = fVar4 + fVar4;
  in_RDI->value[2].field_2.z = 1.0 - (fVar5 + fVar5);
  *(undefined8 *)&in_RDI->value[2].field_3 = 0;
  in_RDI->value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  in_RDI->value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  in_RDI->value[3].field_3.w = 1.0;
  return in_RDI;
}

Assistant:

GLM_FUNC_DECL mat<4, 4, T, Q> toMat4(
		qua<T, Q> const& x){return mat4_cast(x);}